

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

char * format_int(char *t,int64_t i)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  
  uVar2 = -i;
  if (0 < i) {
    uVar2 = i;
  }
  pcVar3 = t + -1;
  do {
    pcVar4 = pcVar3;
    *pcVar4 = "_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar2 % 10 + 0x35];
    pcVar3 = pcVar4 + -1;
    bVar1 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar1);
  if (i < 0) {
    *pcVar3 = '-';
    pcVar4 = pcVar3;
  }
  return pcVar4;
}

Assistant:

static char *
format_int(char *t, int64_t i)
{
	uint64_t ui;

	if (i < 0) 
		ui = (i == INT64_MIN) ? (uint64_t)(INT64_MAX) + 1 : (uint64_t)(-i);
	else
		ui = i;

	do {
		*--t = "0123456789"[ui % 10];
	} while (ui /= 10);
	if (i < 0)
		*--t = '-';
	return (t);
}